

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

void bitset_print(bitset_t *b)

{
  _Bool _Var1;
  size_t *unaff_retaddr;
  size_t i;
  long local_10;
  
  printf("{");
  local_10 = 0;
  while( true ) {
    _Var1 = bitset_next_set_bit((bitset_t *)i,unaff_retaddr);
    if (!_Var1) break;
    printf("%zu, ",local_10);
    local_10 = local_10 + 1;
  }
  printf("}");
  return;
}

Assistant:

inline void bitset_print(const bitset_t *b) {
    printf("{");
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        printf("%zu, ", i);
    }
    printf("}");
}